

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_translateasttobytecode
                   (HSQUIRRELVM v,SqASTData *astData,HSQOBJECT *bindings,SQChar *s,SQInteger size,
                   SQBool raiseerror,SQBool debugInfo)

{
  bool bVar1;
  SQVM *this;
  SQObjectPtr *in_RDI;
  SQVM *in_R9;
  uint uVar2;
  long in_stack_00000008;
  SQObjectPtr o;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SQFunctionProto *func;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  SQObjectValue in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  HSQOBJECT *in_stack_ffffffffffffffb8;
  SqASTData *in_stack_ffffffffffffffc0;
  SQRESULT local_8;
  
  func = (SQFunctionProto *)&stack0xffffffffffffffb8;
  SQObjectPtr::SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar2 = (uint)(in_stack_00000008 != 0);
  bVar1 = SQCompilation::TranslateASTToBytecode
                    (in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (SQObjectPtr *)in_stack_ffffffffffffffa0.pTable,(bool)in_stack_ffffffffffffff9f
                     ,(bool)in_stack_ffffffffffffff9e);
  if (bVar1) {
    this = (SQVM *)SQClosure::Create((SQSharedState *)
                                     CONCAT44(in_stack_ffffffffffffff94,
                                              CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90)),func)
    ;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff98,(SQClosure *)this);
    SQVM::Push(this,in_RDI);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff74,uVar2));
    local_8 = 0;
  }
  else {
    local_8 = -1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff74,uVar2));
  return local_8;
}

Assistant:

SQRESULT sq_translateasttobytecode(HSQUIRRELVM v, SQCompilation::SqASTData *astData, const HSQOBJECT *bindings, const SQChar *s, SQInteger size, SQBool raiseerror, SQBool debugInfo)
{
    SQObjectPtr o;
    if (TranslateASTToBytecode(v, astData, bindings, s, size, o, raiseerror, debugInfo))
    {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o)));
        return SQ_OK;
    }
    return SQ_ERROR;
}